

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O3

QByteArray * __thiscall
QZipReader::fileData(QByteArray *__return_storage_ptr__,QZipReader *this,QString *fileName)

{
  uchar *puVar1;
  uchar *puVar2;
  FileHeader *pFVar3;
  FileHeader *pFVar4;
  QIODevice *pQVar5;
  Data *pDVar6;
  char *pcVar7;
  uint uVar8;
  undefined4 uVar9;
  uint uVar12;
  int iVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  qsizetype qVar20;
  ushort uVar21;
  bool bVar22;
  int iVar23;
  QZipReaderPrivate *pQVar24;
  undefined4 extraout_var;
  char *pcVar25;
  storage_type *in_RCX;
  QArrayData *__nbytes;
  __off_t __length;
  long lVar26;
  storage_type *psVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QStringView rhs;
  QStringView lhs;
  QByteArray local_168;
  QMessageLogger local_148;
  ulong uStack_128;
  ulong local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  ushort uStack_d0;
  undefined4 uStack_ce;
  undefined2 uStack_ca;
  undefined6 uStack_c8;
  undefined1 *puStack_c2;
  QString local_b8;
  uint uStack_a0;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined4 uStack_96;
  undefined2 uStack_92;
  undefined2 local_90;
  int iStack_8e;
  undefined2 uStack_8a;
  QArrayData *pQStack_88;
  char *local_80;
  qsizetype qStack_78;
  QArrayData *local_70;
  char *pcStack_68;
  qsizetype local_60;
  QArrayData *pQStack_58;
  char *local_50;
  qsizetype qStack_48;
  long local_38;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined2 uVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QZipReaderPrivate::scanFiles(this->d);
  pQVar24 = this->d;
  if ((pQVar24->super_QZipPrivate).fileHeaders.d.size != 0) {
    lVar26 = 0x40;
    psVar27 = (storage_type *)0x0;
    do {
      pFVar3 = (pQVar24->super_QZipPrivate).fileHeaders.d.ptr;
      ba.m_data = in_RCX;
      ba.m_size = *(qsizetype *)((pFVar3->h).signature + lVar26 + -8);
      QString::fromLocal8Bit(&local_b8,*(QString **)((pFVar3->h).signature + lVar26),ba);
      lVar18 = CONCAT44(local_b8.d.size._4_4_,(undefined4)local_b8.d.size);
      if (lVar18 == (fileName->d).size) {
        lhs.m_data._4_4_ = local_b8.d.ptr._4_4_;
        lhs.m_data._0_4_ = (uint)local_b8.d.ptr;
        rhs.m_data = (fileName->d).ptr;
        rhs.m_size = lVar18;
        lhs.m_size = lVar18;
        bVar22 = QtPrivate::equalStrings(lhs,rhs);
      }
      else {
        bVar22 = false;
      }
      piVar17 = (int *)CONCAT26(local_b8.d.d._6_2_,CONCAT24(local_b8.d.d._4_2_,local_b8.d.d._0_4_));
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT26(local_b8.d.d._6_2_,CONCAT24(local_b8.d.d._4_2_,local_b8.d.d._0_4_)),2,
                     0x10);
        }
      }
      pQVar24 = this->d;
      if (bVar22 != false) {
        in_RCX = (storage_type *)(pQVar24->super_QZipPrivate).fileHeaders.d.size;
        break;
      }
      psVar27 = psVar27 + 1;
      in_RCX = (storage_type *)(pQVar24->super_QZipPrivate).fileHeaders.d.size;
      lVar26 = lVar26 + 0x78;
    } while (psVar27 < in_RCX);
    if (in_RCX != psVar27) {
      uStack_8a = 0xaaaa;
      pFVar4 = (pQVar24->super_QZipPrivate).fileHeaders.d.ptr;
      pFVar3 = pFVar4 + (long)psVar27;
      local_b8.d.d._0_4_ = *(undefined4 *)(pFVar3->h).signature;
      uVar9._0_1_ = (pFVar3->h).version_made[0];
      uVar9._1_1_ = (pFVar3->h).version_made[1];
      uVar10 = (pFVar3->h).version_needed[0];
      uVar11 = (pFVar3->h).version_needed[1];
      uVar9._2_2_ = CONCAT11(uVar11,uVar10);
      uVar12._0_1_ = (pFVar3->h).general_purpose_bits[0];
      uVar12._1_1_ = (pFVar3->h).general_purpose_bits[1];
      uVar12._2_1_ = (pFVar3->h).compression_method[0];
      uVar12._3_1_ = (pFVar3->h).compression_method[1];
      local_b8.d.ptr._4_4_ = *(undefined4 *)(pFVar3->h).last_mod_file;
      puVar1 = pFVar4[(long)psVar27].h.crc_32;
      local_b8.d.size._0_4_ = *(undefined4 *)puVar1;
      iVar13 = *(int *)(puVar1 + 4);
      uVar8 = *(uint *)(puVar1 + 8);
      pFVar3 = pFVar4 + (long)psVar27;
      puVar2 = (pFVar3->h).extra_field_length;
      uVar14 = (pFVar3->h).file_comment_length[0];
      uVar16 = (pFVar3->h).file_comment_length[1];
      uVar15 = CONCAT11(uVar16,uVar14);
      uStack_96 = *(undefined4 *)(puVar2 + 4);
      iStack_8e = *(int *)(puVar2 + 0xc);
      uStack_92 = (undefined2)*(undefined4 *)(puVar2 + 8);
      local_90 = (undefined2)((uint)*(undefined4 *)(puVar2 + 8) >> 0x10);
      uStack_9c = (undefined2)*(undefined4 *)(puVar1 + 0xc);
      uStack_9a = (undefined2)((uint)*(undefined4 *)(puVar1 + 0xc) >> 0x10);
      local_b8.d.d._4_2_ = (undefined2)uVar9;
      pQStack_88 = &(pFVar4[(long)psVar27].file_name.d.d)->super_QArrayData;
      local_80 = pFVar4[(long)psVar27].file_name.d.ptr;
      qStack_78 = pFVar4[(long)psVar27].file_name.d.size;
      if (pQStack_88 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQStack_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQStack_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_70 = &(pFVar4[(long)psVar27].extra_field.d.d)->super_QArrayData;
      pcStack_68 = pFVar4[(long)psVar27].extra_field.d.ptr;
      local_60 = pFVar4[(long)psVar27].extra_field.d.size;
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      __nbytes = &(pFVar4[(long)psVar27].file_comment.d.d)->super_QArrayData;
      local_50 = pFVar4[(long)psVar27].file_comment.d.ptr;
      qStack_48 = pFVar4[(long)psVar27].file_comment.d.size;
      if (__nbytes != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&__nbytes->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&__nbytes->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b8.d.d._6_2_ = uVar9._2_2_;
      local_b8.d.ptr._0_4_ = uVar12;
      local_b8.d.size._4_4_ = iVar13;
      uStack_a0 = uVar8;
      uStack_98 = uVar15;
      pQStack_58 = __nbytes;
      if ((ushort)uVar9._2_2_ < 0x15) {
        pQVar5 = (this->d->super_QZipPrivate).device;
        (*(pQVar5->super_QObject)._vptr_QObject[0x11])(pQVar5,(long)iStack_8e);
        uStack_c8 = 0xaaaaaaaaaaaa;
        puStack_c2 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_d0 = 0xaaaa;
        uStack_ce = 0xaaaaaaaa;
        uStack_ca = 0xaaaa;
        QIODevice::read((this->d->super_QZipPrivate).device,(int)&local_d8,(void *)0x1e,
                        (size_t)__nbytes);
        uVar28 = (ulong)puStack_c2 >> 0x20;
        uVar19 = (ulong)puStack_c2 >> 0x30;
        pQVar5 = (this->d->super_QZipPrivate).device;
        iVar23 = (*(pQVar5->super_QObject)._vptr_QObject[0xf])(pQVar5);
        (*(pQVar5->super_QObject)._vptr_QObject[0x11])
                  (pQVar5,uVar19 + (uVar28 & 0xffff) + CONCAT44(extraout_var,iVar23));
        uVar21 = uStack_d0;
        if ((uVar12 & 1) == 0) {
          uVar28 = (ulong)uStack_d0;
          local_168.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_168.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_168.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QIODevice::read((QIODevice *)&local_168,(int)(this->d->super_QZipPrivate).device,
                          (char *)(long)iVar13,(size_t)__nbytes);
          if (uVar21 == 8) {
            QByteArray::truncate(&local_168,(char *)(long)iVar13,__length);
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char *)0x0;
            (__return_storage_ptr__->d).size = 0;
            if ((int)uVar8 < 2) {
              uVar8 = 1;
            }
            uVar28 = (ulong)uVar8;
            do {
              QByteArray::resize(__return_storage_ptr__,uVar28);
              pDVar6 = (__return_storage_ptr__->d).d;
              if ((pDVar6 == (Data *)0x0) ||
                 (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                QByteArray::reallocData
                          (__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
              }
              pcVar25 = local_168.d.ptr;
              if (local_168.d.ptr == (char *)0x0) {
                pcVar25 = &QByteArray::_empty;
              }
              pcVar7 = (__return_storage_ptr__->d).ptr;
              local_f0 = 0;
              uStack_e8 = 0;
              local_100 = 0;
              uStack_f8 = 0;
              local_110 = 0;
              uStack_108 = 0;
              local_120 = 0;
              uStack_118 = 0;
              local_148.context.category = (char *)0x0;
              uStack_128 = 0;
              local_148.context.file._4_4_ = 0;
              local_148.context.function._0_4_ = 0;
              local_148.context.function._4_4_ = 0;
              local_e0 = 0;
              local_148.context.version = (int)pcVar25;
              local_148.context.line = (int)((ulong)pcVar25 >> 0x20);
              local_148.context.file._0_4_ = iVar13;
              if ((-1 < iVar13) &&
                 (uStack_128 = uVar28 & 0xffffffff, local_148.context.category = pcVar7,
                 uVar28 >> 0x20 == 0)) {
                iVar23 = inflateInit2_(&local_148,0xfffffff1,"1.2.11",0x70);
                if (iVar23 == 0) {
                  iVar23 = inflate(&local_148,4);
                  uVar19 = local_120;
                  if (iVar23 == 1) {
                    iVar23 = inflateEnd(&local_148);
                    uVar28 = uVar19;
                  }
                  else {
                    inflateEnd(&local_148);
                    if ((iVar23 == 2) || ((iVar23 == -5 && ((int)local_148.context.file == 0))))
                    goto LAB_0026b418;
                  }
                }
                if (iVar23 != -5) goto LAB_0026b3f4;
              }
              uVar28 = uVar28 * 2;
            } while( true );
          }
          if (uVar21 == 0) {
            QByteArray::truncate(&local_168,(char *)(long)(int)uVar8,__length);
            qVar20 = local_168.d.size;
            pcVar25 = local_168.d.ptr;
            pDVar6 = local_168.d.d;
            local_168.d.d = (Data *)0x0;
            local_168.d.ptr = (char *)0x0;
            (__return_storage_ptr__->d).d = pDVar6;
            (__return_storage_ptr__->d).ptr = pcVar25;
            local_168.d.size = 0;
            (__return_storage_ptr__->d).size = qVar20;
          }
          else {
            local_148.context.version = 2;
            local_148.context.line = 0;
            local_148.context.file._0_4_ = 0;
            local_148.context.file._4_4_ = 0;
            local_148.context.function._0_4_ = 0;
            local_148.context.function._4_4_ = 0;
            local_148.context.category = "default";
            QMessageLogger::warning
                      (&local_148,
                       "QZip: Unsupported compression method %d is needed to extract the data.",
                       uVar28);
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char *)0x0;
            (__return_storage_ptr__->d).size = 0;
          }
          goto LAB_0026b47e;
        }
        local_148.context.version = 2;
        local_148.context.line = 0;
        local_148.context.file._0_4_ = 0;
        local_148.context.file._4_4_ = 0;
        local_148.context.function._0_4_ = 0;
        local_148.context.function._4_4_ = 0;
        local_148.context.category = "default";
        QMessageLogger::warning
                  (&local_148,"QZip: Unsupported encryption method is needed to extract the data.");
      }
      else {
        local_148.context.version = 2;
        local_148.context.line = 0;
        local_148.context.file._0_4_ = 0;
        local_148.context.file._4_4_ = 0;
        local_148.context.function._0_4_ = 0;
        local_148.context.function._4_4_ = 0;
        local_148.context.category = "default";
        QMessageLogger::warning
                  (&local_148,
                   "QZip: .ZIP specification version %d implementationis needed to extract the data."
                  );
      }
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      goto LAB_0026b1f5;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  goto LAB_0026af3a;
LAB_0026b3f4:
  if (iVar23 == -4) {
    local_148.context.version = 2;
    local_148.context.line = 0;
    local_148.context.file._0_4_ = 0;
    local_148.context.file._4_4_ = 0;
    local_148.context.function._0_4_ = 0;
    local_148.context.function._4_4_ = 0;
    local_148.context.category = "default";
    QMessageLogger::warning(&local_148,"QZip: Z_MEM_ERROR: Not enough memory");
  }
  else if (iVar23 == -3) {
LAB_0026b418:
    local_148.context.version = 2;
    local_148.context.line = 0;
    local_148.context.file._0_4_ = 0;
    local_148.context.file._4_4_ = 0;
    local_148.context.function._0_4_ = 0;
    local_148.context.function._4_4_ = 0;
    local_148.context.category = "default";
    QMessageLogger::warning(&local_148,"QZip: Z_DATA_ERROR: Input data is corrupted");
  }
  else if ((iVar23 == 0) && ((long)(int)uVar28 != (__return_storage_ptr__->d).size)) {
    QByteArray::resize(__return_storage_ptr__,uVar28);
  }
LAB_0026b47e:
  if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0026b1f5:
  if (pQStack_58 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_58,1,0x10);
    }
  }
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,1,0x10);
    }
  }
  if (pQStack_88 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_88,1,0x10);
    }
  }
LAB_0026af3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QZipReader::fileData(const QString &fileName) const
{
    d->scanFiles();
    int i;
    for (i = 0; i < d->fileHeaders.size(); ++i) {
        if (QString::fromLocal8Bit(d->fileHeaders.at(i).file_name) == fileName)
            break;
    }
    if (i == d->fileHeaders.size())
        return QByteArray();

    FileHeader header = d->fileHeaders.at(i);

    ushort version_needed = readUShort(header.h.version_needed);
    if (version_needed > ZIP_VERSION) {
        qWarning("QZip: .ZIP specification version %d implementationis needed to extract the data.", version_needed);
        return QByteArray();
    }

    ushort general_purpose_bits = readUShort(header.h.general_purpose_bits);
    int compressed_size = readUInt(header.h.compressed_size);
    int uncompressed_size = readUInt(header.h.uncompressed_size);
    int start = readUInt(header.h.offset_local_header);
    //qDebug("uncompressing file %d: local header at %d", i, start);

    d->device->seek(start);
    LocalFileHeader lh;
    d->device->read((char *)&lh, sizeof(LocalFileHeader));
    uint skip = readUShort(lh.file_name_length) + readUShort(lh.extra_field_length);
    d->device->seek(d->device->pos() + skip);

    int compression_method = readUShort(lh.compression_method);
    //qDebug("file=%s: compressed_size=%d, uncompressed_size=%d", fileName.toLocal8Bit().data(), compressed_size, uncompressed_size);

    if ((general_purpose_bits & Encrypted) != 0) {
        qWarning("QZip: Unsupported encryption method is needed to extract the data.");
        return QByteArray();
    }

    //qDebug("file at %lld", d->device->pos());
    QByteArray compressed = d->device->read(compressed_size);
    if (compression_method == CompressionMethodStored) {
        // no compression
        compressed.truncate(uncompressed_size);
        return compressed;
    } else if (compression_method == CompressionMethodDeflated) {
        // Deflate
        //qDebug("compressed=%d", compressed.size());
        compressed.truncate(compressed_size);
        QByteArray baunzip;
        ulong len = qMax(uncompressed_size,  1);
        int res;
        do {
            baunzip.resize(len);
            res = inflate((uchar*)baunzip.data(), &len,
                          (const uchar*)compressed.constData(), compressed_size);

            switch (res) {
            case Z_OK:
                if ((int)len != baunzip.size())
                    baunzip.resize(len);
                break;
            case Z_MEM_ERROR:
                qWarning("QZip: Z_MEM_ERROR: Not enough memory");
                break;
            case Z_BUF_ERROR:
                len *= 2;
                break;
            case Z_DATA_ERROR:
                qWarning("QZip: Z_DATA_ERROR: Input data is corrupted");
                break;
            }
        } while (res == Z_BUF_ERROR);
        return baunzip;
    }

    qWarning("QZip: Unsupported compression method %d is needed to extract the data.", compression_method);
    return QByteArray();
}